

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O2

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* FIX::string_split(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *__return_storage_ptr__,string *value,char delimiter)

{
  _Rb_tree_header *p_Var1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar3 = 0;
  do {
    uVar2 = 0;
    while( true ) {
      if (value->_M_string_length <= uVar3 + uVar2) {
        if (uVar3 < value->_M_string_length) {
          std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)__return_storage_ptr__,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        return __return_storage_ptr__;
      }
      if ((value->_M_dataplus)._M_p[uVar2 + uVar3] == delimiter) break;
      uVar2 = uVar2 + 1;
    }
    if (1 < uVar2) {
      std::__cxx11::string::substr((ulong)&local_50,(ulong)value);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)__return_storage_ptr__,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    uVar3 = uVar3 + uVar2 + 1;
  } while( true );
}

Assistant:

std::set<std::string> string_split(const std::string &value, const char delimiter) {
  std::set<std::string> subStrings;
  std::size_t start = 0;
  for (std::size_t pos = 0; pos < value.size(); ++pos) {
    if (value[pos] == delimiter) {
      if (pos - start > 1) {
        subStrings.insert(value.substr(start, pos - start));
      }
      start = pos + 1;
    }
  }
  if (start < value.size()) {
    subStrings.insert(value.substr(start, value.size() - start));
  }
  return subStrings;
}